

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_assembly_tests.cc
# Opt level: O0

void __thiscall
projects_ipdg_stokes_assembly_global_matrix_assembly_2_Test::TestBody
          (projects_ipdg_stokes_assembly_global_matrix_assembly_2_Test *this)

{
  allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_> *this_00;
  double lhs_value;
  initializer_list<std::pair<const_lf::base::RefEl,_unsigned_int>_> __l;
  bool bVar1;
  size_type sVar2;
  size_type num_rows;
  size_type num_cols;
  CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_> *pCVar3;
  long lVar4;
  Index IVar5;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar6;
  char *pcVar7;
  ostream *this_01;
  CoeffReturnType pdVar8;
  Scalar *pSVar9;
  Message *pMVar10;
  anon_class_1_0_00000001_for_op *func;
  __type_conflict1 _Var11;
  AssertHelper local_6e0;
  Message local_6d8;
  undefined1 local_6d0 [8];
  AssertionResult gtest_ar_2;
  int j;
  int i_1;
  Message local_6b0;
  Index local_6a8;
  Index local_6a0;
  undefined1 local_698 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_680;
  Message local_678;
  Index local_670;
  Index local_668;
  undefined1 local_660 [8];
  AssertionResult gtest_ar;
  Scalar local_648;
  Scalar local_640;
  Scalar local_638;
  Scalar local_630;
  Scalar local_628;
  double local_620;
  Scalar local_618;
  Scalar local_610;
  Scalar local_608;
  Scalar local_600;
  Scalar local_5f8;
  Scalar local_5f0;
  double local_5e8;
  Scalar local_5e0;
  Scalar local_5d8;
  Scalar local_5d0;
  Scalar local_5c8;
  Scalar local_5c0;
  Scalar local_5b8;
  Scalar local_5b0;
  Scalar local_5a8;
  Scalar local_5a0;
  double local_598;
  Scalar local_590;
  Scalar local_588;
  Scalar local_580;
  Scalar local_578;
  Scalar local_570;
  Scalar local_568;
  Scalar local_560;
  Scalar local_558;
  Scalar local_550;
  Scalar local_548;
  Scalar local_540;
  Scalar local_538;
  Scalar local_530;
  Scalar local_528;
  Scalar local_520;
  Scalar local_518;
  double local_510;
  Scalar local_508;
  Scalar local_500;
  Scalar local_4f8;
  Scalar local_4f0;
  Scalar local_4e8;
  Scalar local_4e0;
  Scalar local_4d8;
  double local_4d0;
  double local_4c8;
  Scalar local_4c0;
  Scalar local_4b8;
  Scalar local_4b0;
  Scalar local_4a8;
  Scalar local_4a0;
  Scalar local_498;
  Scalar local_490;
  Scalar local_488;
  Scalar local_480;
  Scalar local_478;
  Scalar local_470;
  Scalar local_468;
  Scalar local_460;
  Scalar local_458;
  Scalar local_450;
  Scalar local_448;
  double local_440;
  Scalar local_438;
  double local_430;
  Scalar local_428;
  Scalar local_420;
  Scalar local_418;
  Scalar local_410;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_408;
  double local_3e8;
  double p;
  double s;
  double r;
  undefined1 local_3c8 [8];
  MatrixXd A_anal;
  Matrix<double,__1,__1,_0,__1,__1> local_3a8;
  CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_assemble_test_matrix_assembly_tests_cc:190:7),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  *local_390 [2];
  undefined1 local_380 [8];
  MatrixXd A;
  COOMatrix<double> A_coo;
  PiecewiseConstElementMatrixProvider elem_mat_provider;
  double sigma;
  undefined1 local_318 [8];
  AllCodimMeshDataSet<bool> boundary;
  int local_2d8;
  RefEl local_2d1;
  int local_2d0;
  RefEl local_2c9;
  pair<const_lf::base::RefEl,_unsigned_int> local_2c8;
  pair<const_lf::base::RefEl,_unsigned_int> local_2c0;
  iterator local_2b8;
  size_type local_2b0;
  map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>
  local_2a8;
  shared_ptr<const_lf::mesh::Mesh> local_278;
  undefined1 local_268 [8];
  UniformFEDofHandler dofh;
  shared_ptr<lf::mesh::Mesh> mesh;
  anon_class_16_2_a7d1fd3c add_triangle;
  anon_class_16_2_a7d1fd3c add_edge;
  coord_t local_150;
  int local_13c;
  size_type sStack_138;
  int i;
  size_type v_idx [4];
  Scalar local_120;
  Scalar local_118;
  Scalar local_110;
  Scalar local_108;
  Scalar local_100;
  Scalar local_f8;
  Scalar local_f0;
  CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_> local_e8;
  undefined1 local_b8 [8];
  Matrix<double,_2,_4,_0,_2,_4> vertices;
  undefined1 local_70 [8];
  MeshFactory factory;
  projects_ipdg_stokes_assembly_global_matrix_assembly_2_Test *this_local;
  
  factory._88_8_ = this;
  lf::mesh::hybrid2d::MeshFactory::MeshFactory((MeshFactory *)local_70,2,true);
  Eigen::Matrix<double,_2,_4,_0,_2,_4>::Matrix((Matrix<double,_2,_4,_0,_2,_4> *)local_b8);
  local_f0 = -1.0;
  Eigen::DenseBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::operator<<
            (&local_e8,(DenseBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_> *)local_b8,&local_f0);
  local_f8 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::operator_
                     (&local_e8,&local_f8);
  local_100 = 1.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::operator_
                     (pCVar3,&local_100);
  local_108 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::operator_
                     (pCVar3,&local_108);
  local_110 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::operator_
                     (pCVar3,&local_110);
  local_118 = -1.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::operator_
                     (pCVar3,&local_118);
  local_120 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::operator_
                     (pCVar3,&local_120);
  v_idx[2] = 0;
  v_idx[3] = 0x3ff00000;
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::operator_
            (pCVar3,(Scalar *)(v_idx + 2));
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::~CommaInitializer(&local_e8);
  for (local_13c = 0; lVar4 = (long)local_13c,
      IVar5 = Eigen::PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::cols
                        ((PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_> *)local_b8),
      lVar4 < IVar5; local_13c = local_13c + 1) {
    Eigen::DenseBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::col
              ((ColXpr *)&add_edge.factory,
               (DenseBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_> *)local_b8,(long)local_13c);
    Eigen::Matrix<double,-1,1,0,-1,1>::
    Matrix<Eigen::Block<Eigen::Matrix<double,2,4,0,2,4>,2,1,true>>
              ((Matrix<double,_1,1,0,_1,1> *)&local_150,
               (EigenBase<Eigen::Block<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true>_> *)
               &add_edge.factory);
    sVar2 = lf::mesh::hybrid2d::MeshFactory::AddPoint((MeshFactory *)local_70,&local_150);
    (&sStack_138)[local_13c] = sVar2;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_150);
  }
  add_triangle.factory = (MeshFactory *)local_b8;
  add_edge.vertices = (Matrix<double,_2,_4,_0,_2,_4> *)local_70;
  TestBody::anon_class_16_2_a7d1fd3c::operator()
            ((anon_class_16_2_a7d1fd3c *)&add_triangle.factory,0,1);
  TestBody::anon_class_16_2_a7d1fd3c::operator()
            ((anon_class_16_2_a7d1fd3c *)&add_triangle.factory,1,3);
  TestBody::anon_class_16_2_a7d1fd3c::operator()
            ((anon_class_16_2_a7d1fd3c *)&add_triangle.factory,3,0);
  TestBody::anon_class_16_2_a7d1fd3c::operator()
            ((anon_class_16_2_a7d1fd3c *)&add_triangle.factory,1,2);
  TestBody::anon_class_16_2_a7d1fd3c::operator()
            ((anon_class_16_2_a7d1fd3c *)&add_triangle.factory,2,3);
  mesh.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8;
  add_triangle.vertices = (Matrix<double,_2,_4,_0,_2,_4> *)local_70;
  TestBody::anon_class_16_2_a7d1fd3c::operator()
            ((anon_class_16_2_a7d1fd3c *)
             &mesh.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount,0,1,3)
  ;
  TestBody::anon_class_16_2_a7d1fd3c::operator()
            ((anon_class_16_2_a7d1fd3c *)
             &mesh.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount,2,1,3)
  ;
  lf::mesh::hybrid2d::MeshFactory::Build((MeshFactory *)&dofh.num_loc_dof_quad_);
  std::shared_ptr<lf::mesh::Mesh_const>::shared_ptr<lf::mesh::Mesh,void>
            ((shared_ptr<lf::mesh::Mesh_const> *)&local_278,
             (shared_ptr<lf::mesh::Mesh> *)&dofh.num_loc_dof_quad_);
  local_2c9 = lf::base::RefEl::kPoint();
  local_2d0 = 1;
  std::pair<const_lf::base::RefEl,_unsigned_int>::pair<lf::base::RefEl,_int,_true>
            (&local_2c8,&local_2c9,&local_2d0);
  local_2d1 = lf::base::RefEl::kSegment();
  local_2d8 = 1;
  std::pair<const_lf::base::RefEl,_unsigned_int>::pair<lf::base::RefEl,_int,_true>
            (&local_2c0,&local_2d1,&local_2d8);
  local_2b8 = &local_2c8;
  local_2b0 = 2;
  this_00 = (allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_> *)
            ((long)&boundary.data_.m_holder.m_capacity + 6);
  std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>::allocator(this_00);
  __l._M_len = local_2b0;
  __l._M_array = local_2b8;
  std::
  map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>
  ::map(&local_2a8,__l,(less<lf::base::RefEl> *)((long)&boundary.data_.m_holder.m_capacity + 7),
        this_00);
  lf::assemble::UniformFEDofHandler::UniformFEDofHandler
            ((UniformFEDofHandler *)local_268,&local_278,&local_2a8,true);
  std::
  map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>
  ::~map(&local_2a8);
  std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>::~allocator
            ((allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_> *)
             ((long)&boundary.data_.m_holder.m_capacity + 6));
  std::shared_ptr<const_lf::mesh::Mesh>::~shared_ptr(&local_278);
  std::shared_ptr<lf::mesh::Mesh_const>::shared_ptr<lf::mesh::Mesh,void>
            ((shared_ptr<lf::mesh::Mesh_const> *)&sigma,
             (shared_ptr<lf::mesh::Mesh> *)&dofh.num_loc_dof_quad_);
  lf::mesh::utils::flagEntitiesOnBoundary
            ((AllCodimMeshDataSet<bool> *)local_318,(shared_ptr<const_lf::mesh::Mesh> *)&sigma);
  std::shared_ptr<const_lf::mesh::Mesh>::~shared_ptr((shared_ptr<const_lf::mesh::Mesh> *)&sigma);
  projects::ipdg_stokes::assemble::PiecewiseConstElementMatrixProvider::
  PiecewiseConstElementMatrixProvider
            ((PiecewiseConstElementMatrixProvider *)
             &A_coo.triplets_.
              super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,10.0,(MeshDataSet<bool> *)local_318
             ,false);
  num_rows = lf::assemble::UniformFEDofHandler::NumDofs((UniformFEDofHandler *)local_268);
  num_cols = lf::assemble::UniformFEDofHandler::NumDofs((UniformFEDofHandler *)local_268);
  lf::assemble::COOMatrix<double>::COOMatrix
            ((COOMatrix<double> *)
             &A.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols,
             num_rows,num_cols);
  lf::assemble::
  AssembleMatrixLocally<lf::assemble::COOMatrix<double>,_projects::ipdg_stokes::assemble::PiecewiseConstElementMatrixProvider>
            (0,(DofHandler *)local_268,(DofHandler *)local_268,
             (PiecewiseConstElementMatrixProvider *)
             &A_coo.triplets_.
              super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (COOMatrix<double> *)
             &A.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  lf::assemble::COOMatrix<double>::makeDense
            (&local_3a8,
             (COOMatrix<double> *)
             &A.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  local_390[0] = Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
                 unaryExpr<projects_ipdg_stokes_assembly_global_matrix_assembly_2_Test::TestBody()::__0>
                           ((CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_assemble_test_matrix_assembly_tests_cc:190:7),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                             *)&local_3a8,
                            (DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
                            ((long)&A_anal.
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                    .m_storage.m_cols + 7),func);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseUnaryOp<projects_ipdg_stokes_assembly_global_matrix_assembly_2_Test::TestBody()::__0,Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_380,
             (EigenBase<Eigen::CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_assemble_test_matrix_assembly_tests_cc:190:7),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)local_390);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_3a8);
  r._4_4_ = 9;
  r._0_4_ = 9;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_3c8,(int *)((long)&r + 4),(int *)&r);
  _Var11 = std::sqrt<int>(2);
  s = 1.0 / _Var11;
  p = 0.1;
  local_3e8 = sqrt(2.0);
  local_3e8 = 0.5 / local_3e8;
  local_410 = 0.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator<<
            (&local_408,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_3c8,&local_410
            );
  local_418 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (&local_408,&local_418);
  local_420 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_420);
  local_428 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_428);
  local_430 = -s;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_430);
  local_438 = 1.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_438);
  local_440 = -s;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_440);
  local_448 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_448);
  local_450 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_450);
  local_458 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_458);
  local_460 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_460);
  local_468 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_468);
  local_470 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_470);
  local_478 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_478);
  local_480 = -1.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_480);
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar6,&s);
  local_488 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_488);
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar6,&s);
  local_490 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_490);
  local_498 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_498);
  local_4a0 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_4a0);
  local_4a8 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_4a8);
  local_4b0 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_4b0);
  local_4b8 = 1.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_4b8);
  local_4c0 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_4c0);
  local_4c8 = -s;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_4c8);
  local_4d0 = -s;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_4d0);
  local_4d8 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_4d8);
  local_4e0 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_4e0);
  local_4e8 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_4e8);
  local_4f0 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_4f0);
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar6,&s);
  local_4f8 = -1.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_4f8);
  local_500 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_500);
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar6,&s);
  local_508 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_508);
  local_510 = -s;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_510);
  local_518 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_518);
  local_520 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_520);
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar6,&s);
  local_528 = -0.1;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_528);
  local_530 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_530);
  local_538 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_538);
  local_540 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_540);
  local_548 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_548);
  local_550 = 1.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_550);
  local_558 = -1.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_558);
  local_560 = 1.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_560);
  local_568 = -1.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_568);
  local_570 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_570);
  local_578 = -0.1;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_578);
  local_580 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_580);
  local_588 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_588);
  local_590 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_590);
  local_598 = -s;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_598);
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar6,&s);
  local_5a0 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_5a0);
  local_5a8 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_5a8);
  local_5b0 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_5b0);
  local_5b8 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_5b8);
  local_5c0 = -0.1;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_5c0);
  local_5c8 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_5c8);
  local_5d0 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_5d0);
  local_5d8 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_5d8);
  local_5e0 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_5e0);
  local_5e8 = -s;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_5e8);
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar6,&s);
  local_5f0 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_5f0);
  local_5f8 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_5f8);
  local_600 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_600);
  local_608 = -0.1;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_608);
  local_610 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_610);
  local_618 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_618);
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar6,&s);
  local_620 = -s;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_620);
  local_628 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_628);
  local_630 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_630);
  local_638 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_638);
  local_640 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_640);
  local_648 = 0.0;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar6,&local_648);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0xbfb999999999999a;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
            (pCVar6,(Scalar *)&gtest_ar.message_);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer(&local_408);
  local_668 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                        ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_380);
  local_670 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                        ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_3c8);
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)local_660,"A.rows()","A_anal.rows()",&local_668,&local_670);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_660);
  if (!bVar1) {
    testing::Message::Message(&local_678);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_660);
    testing::internal::AssertHelper::AssertHelper
              (&local_680,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/ipdg_stokes/assemble/test/matrix_assembly_tests.cc"
               ,0xd1,pcVar7);
    testing::internal::AssertHelper::operator=(&local_680,&local_678);
    testing::internal::AssertHelper::~AssertHelper(&local_680);
    testing::Message::~Message(&local_678);
  }
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_660);
  if (gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    local_6a0 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                          ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_380);
    local_6a8 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                          ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_3c8);
    testing::internal::EqHelper::Compare<long,_long,_nullptr>
              ((EqHelper *)local_698,"A.cols()","A_anal.cols()",&local_6a0,&local_6a8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_698);
    if (!bVar1) {
      testing::Message::Message(&local_6b0);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_698);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&j,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/ipdg_stokes/assemble/test/matrix_assembly_tests.cc"
                 ,0xd2,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&j,&local_6b0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&j);
      testing::Message::~Message(&local_6b0);
    }
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_698);
    if (gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      this_01 = Eigen::operator<<((ostream *)&std::cout,
                                  (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_3c8)
      ;
      std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
      for (gtest_ar_2.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl._4_4_ = 0;
          lVar4 = (long)gtest_ar_2.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_4_,
          IVar5 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_3c8
                            ), lVar4 < IVar5;
          gtest_ar_2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ =
               gtest_ar_2.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl._4_4_ + 1) {
        for (gtest_ar_2.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl._0_4_ = 0;
            lVar4 = (long)(int)gtest_ar_2.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl,
            IVar5 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                              ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                               local_3c8), lVar4 < IVar5;
            gtest_ar_2.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._0_4_ =
                 (int)gtest_ar_2.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl + 1) {
          pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)
                              local_380,
                              (long)gtest_ar_2.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl._4_4_,
                              (long)(int)gtest_ar_2.message_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl);
          lhs_value = *pdVar8;
          pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                              local_3c8,
                              (long)gtest_ar_2.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl._4_4_,
                              (long)(int)gtest_ar_2.message_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl);
          testing::internal::CmpHelperFloatingPointEQ<double>
                    ((internal *)local_6d0,"A(i, j)","A_anal(i, j)",lhs_value,*pSVar9);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6d0);
          if (!bVar1) {
            testing::Message::Message(&local_6d8);
            pMVar10 = testing::Message::operator<<(&local_6d8,(char (*) [20])"mismatch in entry (");
            pMVar10 = testing::Message::operator<<
                                (pMVar10,(int *)((long)&gtest_ar_2.message_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                + 4));
            pMVar10 = testing::Message::operator<<(pMVar10,(char (*) [3])0xa947a8);
            pMVar10 = testing::Message::operator<<(pMVar10,(int *)&gtest_ar_2.message_);
            pMVar10 = testing::Message::operator<<(pMVar10,(char (*) [2])0xaba49c);
            pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_6d0);
            testing::internal::AssertHelper::AssertHelper
                      (&local_6e0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/ipdg_stokes/assemble/test/matrix_assembly_tests.cc"
                       ,0xd6,pcVar7);
            testing::internal::AssertHelper::operator=(&local_6e0,pMVar10);
            testing::internal::AssertHelper::~AssertHelper(&local_6e0);
            testing::Message::~Message(&local_6d8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_6d0);
        }
      }
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ = 0;
    }
  }
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_3c8);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_380);
  lf::assemble::COOMatrix<double>::~COOMatrix
            ((COOMatrix<double> *)
             &A.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  lf::mesh::utils::AllCodimMeshDataSet<bool>::~AllCodimMeshDataSet
            ((AllCodimMeshDataSet<bool> *)local_318);
  lf::assemble::UniformFEDofHandler::~UniformFEDofHandler((UniformFEDofHandler *)local_268);
  std::shared_ptr<lf::mesh::Mesh>::~shared_ptr
            ((shared_ptr<lf::mesh::Mesh> *)&dofh.num_loc_dof_quad_);
  lf::mesh::hybrid2d::MeshFactory::~MeshFactory((MeshFactory *)local_70);
  return;
}

Assistant:

TEST(projects_ipdg_stokes_assembly, global_matrix_assembly_2) {
  // Building a mesh out of two triangles such that
  // the shared edge has the same orientation for each of them
  lf::mesh::hybrid2d::MeshFactory factory(2);
  Eigen::Matrix<double, 2, 4> vertices;
  vertices << -1, 0, 1, 0, 0, -1, 0, 1;
  lf::base::size_type v_idx[4];
  // Add the vertices
  for (int i = 0; i < vertices.cols(); ++i)
    v_idx[i] = factory.AddPoint(vertices.col(i));
  // Add the edges
  auto add_edge = [&](unsigned v1, unsigned v2) {
    const std::array<lf::base::size_type, 2> indices = {v1, v2};
    Eigen::Matrix<double, 2, 2> verts;
    verts << vertices.col(v1), vertices.col(v2);
    std::unique_ptr<lf::geometry::Geometry> geom =
        std::make_unique<lf::geometry::SegmentO1>(verts);
    factory.AddEntity(lf::base::RefEl::kSegment(), std::span(indices.data(), 2),
                      std::move(geom));
  };
  add_edge(0, 1);
  add_edge(1, 3);
  add_edge(3, 0);
  add_edge(1, 2);
  add_edge(2, 3);
  // Add the elements
  auto add_triangle = [&](unsigned v1, unsigned v2, unsigned v3) {
    const std::array<lf::base::size_type, 3> indices = {v1, v2, v3};
    Eigen::Matrix<double, 2, 3> verts;
    verts << vertices.col(v1), vertices.col(v2), vertices.col(v3);
    std::unique_ptr<lf::geometry::Geometry> geom =
        std::make_unique<lf::geometry::TriaO1>(verts);
    factory.AddEntity(lf::base::RefEl::kTria(), std::span(indices.data(), 3),
                      std::move(geom));
  };
  add_triangle(0, 1, 3);
  add_triangle(2, 1, 3);
  const auto mesh = factory.Build();

  // Compute the system matrix for the mesh
  lf::assemble::UniformFEDofHandler dofh(
      mesh, {{lf::base::RefEl::kPoint(), 1}, {lf::base::RefEl::kSegment(), 1}});
  const auto boundary = lf::mesh::utils::flagEntitiesOnBoundary(mesh);
  const double sigma = 10;
  projects::ipdg_stokes::assemble::PiecewiseConstElementMatrixProvider
      elem_mat_provider(sigma, boundary);
  lf::assemble::COOMatrix<double> A_coo(dofh.NumDofs(), dofh.NumDofs());
  lf::assemble::AssembleMatrixLocally(0, dofh, dofh, elem_mat_provider, A_coo);
  const Eigen::MatrixXd A = A_coo.makeDense().unaryExpr(
      [](double x) { return (std::fabs(x) <= 1e-100 ? 0. : x); });

  // Construct the analytical system matrix
  Eigen::MatrixXd A_anal(9, 9);
  const double r = 1. / std::sqrt(2);
  const double s = 1. / sigma;
  const double p = 0.5 / sqrt(2);
  // clang-format off
  A_anal <<  0,  0,  0,  0, -r,  1, -r,  0,  0,
	     0,  0,  0,  0,  0, -1,  r,  0,  r,
	     0,  0,  0,  0,  0,  1,  0, -r, -r,
	     0,  0,  0,  0,  r, -1,  0,  r,  0,
	    -r,  0,  0,  r, -s,  0,  0,  0,  0,
	     1, -1,  1, -1,  0, -s,  0,  0,  0,
	    -r,  r,  0,  0,  0,  0, -s,  0,  0,
	     0,  0, -r,  r,  0,  0,  0, -s,  0,
	     0,  r, -r,  0,  0,  0,  0,  0, -s;
  // clang-format on
  // Assert that the two matrices are approximately equal
  ASSERT_EQ(A.rows(), A_anal.rows());
  ASSERT_EQ(A.cols(), A_anal.cols());
  std::cout << A_anal << std::endl;
  for (int i = 0; i < A_anal.rows(); ++i) {
    for (int j = 0; j < A_anal.cols(); ++j) {
      EXPECT_DOUBLE_EQ(A(i, j), A_anal(i, j))
          << "mismatch in entry (" << i << ", " << j << ")";
    }
  }
}